

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

char * __thiscall
cmLocalGenerator::GetFeature(cmLocalGenerator *this,string *feature,string *config)

{
  cmStateSnapshot *this_00;
  pointer pcVar1;
  bool bVar2;
  char *pcVar3;
  string featureName;
  cmStateSnapshot snp;
  string local_90;
  undefined1 local_70 [16];
  undefined1 local_60 [32];
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcStack_40;
  PositionType local_38;
  
  pcVar1 = (feature->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + feature->_M_string_length);
  if (config->_M_string_length != 0) {
    std::__cxx11::string::append((char *)&local_90);
    cmsys::SystemTools::UpperCase((string *)local_70,config);
    std::__cxx11::string::_M_append((char *)&local_90,local_70._0_8_);
    if ((cmState *)local_70._0_8_ != (cmState *)(local_70 + 0x10)) {
      operator_delete((void *)local_70._0_8_,local_60._0_8_ + 1);
    }
  }
  local_38 = (this->StateSnapshot).Position.Position;
  this_00 = (cmStateSnapshot *)(local_60 + 0x18);
  local_60._24_8_ = (this->StateSnapshot).State;
  pcStack_40 = (this->StateSnapshot).Position.Tree;
  while (bVar2 = cmStateSnapshot::IsValid(this_00), pcVar3 = (char *)0x0, bVar2) {
    cmStateSnapshot::GetDirectory((cmStateDirectory *)local_70,this_00);
    pcVar3 = cmStateDirectory::GetProperty((cmStateDirectory *)local_70,&local_90);
    if (pcVar3 != (char *)0x0) break;
    cmStateSnapshot::GetBuildsystemDirectoryParent((cmStateSnapshot *)local_70,this_00);
    local_38 = local_60._0_8_;
    local_60._24_8_ = local_70._0_8_;
    pcStack_40 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_70._8_8_;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return pcVar3;
}

Assistant:

const char* cmLocalGenerator::GetFeature(const std::string& feature,
                                         const std::string& config)
{
  std::string featureName = feature;
  // TODO: Define accumulation policy for features (prepend, append, replace).
  // Currently we always replace.
  if (!config.empty()) {
    featureName += "_";
    featureName += cmSystemTools::UpperCase(config);
  }
  cmStateSnapshot snp = this->StateSnapshot;
  while (snp.IsValid()) {
    if (const char* value = snp.GetDirectory().GetProperty(featureName)) {
      return value;
    }
    snp = snp.GetBuildsystemDirectoryParent();
  }
  return CM_NULLPTR;
}